

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

string * __thiscall
pstore::http::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int error)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(error) {
  case 1:
    pcVar2 = "Bad request";
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = "Bad WebSocket version requested";
    paVar1 = &local_a;
    break;
  case 3:
    pcVar2 = "Not implemented";
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = "String too long";
    paVar1 = &local_c;
    break;
  case 5:
    pcVar2 = "Refill result out of range";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "unknown pstore::category error";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string error_category::message (int const error) const {
            switch (static_cast<error_code> (error)) {
            case error_code::bad_request: return "Bad request";
            case error_code::bad_websocket_version: return "Bad WebSocket version requested";
            case error_code::not_implemented: return "Not implemented";
            case error_code::string_too_long: return "String too long";
            case error_code::refill_out_of_range: return "Refill result out of range";
            }
            return "unknown pstore::category error";
        }